

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::iterate
          (TestStatus *__return_storage_ptr__,OcclusionQueryTestInstance *this)

{
  pointer *ppuVar1;
  void **ppvVar2;
  void **ppvVar3;
  deUint32 *pdVar4;
  OcclusionQueryWait OVar5;
  OcclusionQueryResultsMode OVar6;
  OcclusionQueryResultSize OVar7;
  VkPrimitiveTopology VVar8;
  TestLog *this_00;
  StateObjects *this_01;
  Allocation *pAVar9;
  VkSemaphore *__src;
  VkDeviceSize VVar10;
  TestLog *pTVar11;
  ulong uVar12;
  bool bVar13;
  VkResult VVar14;
  VkQueue pVVar15;
  DeviceInterface *vk;
  pointer __s;
  VkDevice device;
  DeviceInterface *vkd;
  TestError *pTVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  deUint64 *pdVar20;
  deUint64 dVar21;
  int iVar22;
  ulong uVar23;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resultsBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_240;
  string local_228;
  deUint64 queryResults [3];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  VkSubmitInfo submitInfoReset;
  ios_base local_150 [264];
  deUint64 queryAvailability [3];
  
  pVVar15 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  this_00 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0x90);
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = __s;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = __s;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = __s + 9;
  memset(__s,0,0x90);
  __s->m_data[0] = 0.5;
  __s->m_data[1] = 0.5;
  __s->m_data[2] = 0.5;
  __s->m_data[3] = 1.0;
  __s[1].m_data[0] = 0.5;
  __s[1].m_data[1] = -0.5;
  __s[1].m_data[2] = 0.5;
  __s[1].m_data[3] = 1.0;
  __s[2].m_data[0] = -0.5;
  __s[2].m_data[1] = 0.5;
  __s[2].m_data[2] = 0.5;
  __s[2].m_data[3] = 1.0;
  __s[3].m_data[0] = -0.5;
  __s[3].m_data[1] = -0.5;
  __s[3].m_data[2] = 1.0;
  __s[3].m_data[3] = 1.0;
  __s[4].m_data[0] = 0.5;
  __s[4].m_data[1] = -0.5;
  __s[4].m_data[2] = 1.0;
  __s[4].m_data[3] = 1.0;
  __s[5].m_data[0] = -0.5;
  __s[5].m_data[1] = 0.5;
  __s[5].m_data[2] = 1.0;
  __s[5].m_data[3] = 1.0;
  __s[6].m_data[0] = 0.5;
  __s[6].m_data[1] = 0.5;
  __s[6].m_data[2] = 1.0;
  __s[6].m_data[3] = 1.0;
  __s[7].m_data[0] = 0.5;
  __s[7].m_data[1] = -0.5;
  __s[7].m_data[2] = 1.0;
  __s[7].m_data[3] = 1.0;
  __s[8].m_data[0] = -0.5;
  __s[8].m_data[1] = 0.5;
  __s[8].m_data[2] = 1.0;
  __s[8].m_data[3] = 1.0;
  this_01 = this->m_stateObjects;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = __s + 9;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_240,&vertices);
  StateObjects::setVertices(this_01,vk,&local_240);
  if (local_240.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((this->m_testVector).queryResultsMode != RESULTS_MODE_COPY) &&
     ((this->m_testVector).queryWait != WAIT_QUEUE)) {
    submitInfoReset.pNext = (void *)0x0;
    submitInfoReset.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    submitInfoReset.signalSemaphoreCount = 0;
    submitInfoReset._60_4_ = 0;
    submitInfoReset.waitSemaphoreCount = 0;
    submitInfoReset._20_4_ = 0;
    submitInfoReset.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.pSignalSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submitInfoReset._4_4_ = 0;
    submitInfoReset.commandBufferCount = 1;
    submitInfoReset._44_4_ = 0;
    submitInfoReset.pCommandBuffers = (VkCommandBuffer *)&this->m_queryPoolResetCommandBuffer;
    (*vk->_vptr_DeviceInterface[2])(vk,pVVar15,1,&submitInfoReset,0);
    VVar14 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar15);
    ::vk::checkResult(VVar14,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x292);
  }
  submitInfoReset.pNext = (void *)0x0;
  submitInfoReset.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfoReset.signalSemaphoreCount = 0;
  submitInfoReset._60_4_ = 0;
  submitInfoReset.waitSemaphoreCount = 0;
  submitInfoReset._20_4_ = 0;
  submitInfoReset.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfoReset.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfoReset.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfoReset._4_4_ = 0;
  submitInfoReset.commandBufferCount = 1;
  submitInfoReset._44_4_ = 0;
  submitInfoReset.pCommandBuffers = (VkCommandBuffer *)&this->m_renderCommandBuffer;
  (*vk->_vptr_DeviceInterface[2])(vk,pVVar15,1,&submitInfoReset,0);
  if ((this->m_testVector).queryWait == WAIT_QUEUE) {
    VVar14 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar15);
    ::vk::checkResult(VVar14,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x2a7);
  }
  if (((this->m_testVector).queryResultsMode == RESULTS_MODE_COPY) &&
     ((this->m_testVector).queryWait == WAIT_QUEUE)) {
    submitInfoReset.pNext = (void *)0x0;
    submitInfoReset.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    submitInfoReset.signalSemaphoreCount = 0;
    submitInfoReset._60_4_ = 0;
    submitInfoReset.waitSemaphoreCount = 0;
    submitInfoReset._20_4_ = 0;
    submitInfoReset.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.pSignalSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submitInfoReset._4_4_ = 0;
    submitInfoReset.commandBufferCount = 1;
    submitInfoReset._44_4_ = 0;
    submitInfoReset.pCommandBuffers = (VkCommandBuffer *)&this->m_copyResultsCommandBuffer;
    (*vk->_vptr_DeviceInterface[2])(vk,pVVar15,1,&submitInfoReset,0);
  }
  if ((this->m_testVector).queryResultsMode == RESULTS_MODE_COPY) {
    VVar14 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar15);
    ::vk::checkResult(VVar14,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x2c5);
  }
  OVar5 = (this->m_testVector).queryWait;
  device = Context::getDevice((this->super_TestInstance).m_context);
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&resultsBuffer,(this->m_testVector).queryResultsStride * 3,
             (allocator_type *)&submitInfoReset);
  OVar6 = (this->m_testVector).queryResultsMode;
  if (OVar6 == RESULTS_MODE_COPY) {
    pAVar9 = (((this->m_queryPoolResultsBuffer).m_ptr)->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    submitInfoReset._0_8_ = &PTR__Allocation_00d49bf8;
    submitInfoReset.pNext = (void *)(pAVar9->m_memory).m_internal;
    submitInfoReset._16_8_ = pAVar9->m_offset;
    __src = (VkSemaphore *)pAVar9->m_hostPtr;
    submitInfoReset.pWaitSemaphores = __src;
    ::vk::invalidateMappedMemoryRange
              (vkd,device,(VkDeviceMemory)submitInfoReset.pNext,submitInfoReset._16_8_,
               (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    memcpy(resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,__src,
           (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    ::vk::Allocation::~Allocation((Allocation *)&submitInfoReset);
  }
  else if (OVar6 == RESULTS_MODE_GET) {
    VVar14 = (*vkd->_vptr_DeviceInterface[0x20])
                       (vkd,device,(this->m_queryPool).m_internal,0,3,
                        (long)resultsBuffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)resultsBuffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        resultsBuffer.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,(this->m_testVector).queryResultsStride,
                        (ulong)this->m_queryResultFlags);
    if ((OVar5 != WAIT_NONE) && (VVar14 == VK_NOT_READY)) {
      pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar16,
                 "getQueryPoolResults returned VK_NOT_READY, but results should be already available."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                 ,0x373);
      __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    ::vk::checkResult(VVar14,"queryResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x377);
  }
  OVar7 = (this->m_testVector).queryResultSize;
  if (RESULT_SIZE_32_BIT < OVar7) {
    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar16,"Wrong m_testVector.queryResultSize",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
               ,0x39f);
    __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  bVar13 = (this->m_testVector).queryResultsAvailability;
  VVar10 = (this->m_testVector).queryResultsStride;
  lVar19 = 0;
  pdVar20 = (deUint64 *)
            resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (OVar7 == RESULT_SIZE_32_BIT) {
      queryResults[lVar19] = (ulong)(uint)*pdVar20;
      if ((bVar13 & 1U) != 0) {
        dVar21 = (deUint64)*(uint *)((long)pdVar20 + 4);
LAB_006c1cf5:
        queryAvailability[lVar19] = dVar21;
      }
    }
    else {
      queryResults[lVar19] = *pdVar20;
      if ((bVar13 & 1U) != 0) {
        dVar21 = pdVar20[1];
        goto LAB_006c1cf5;
      }
    }
    lVar19 = lVar19 + 1;
    pdVar20 = (deUint64 *)((long)pdVar20 + VVar10);
  } while (lVar19 != 3);
  if (resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)resultsBuffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)resultsBuffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ppuVar1 = &resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&resultsBuffer,"OcclusionQueryResults","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Occlusion query results","")
  ;
  tcu::LogSection::LogSection((LogSection *)&submitInfoReset,(string *)&resultsBuffer,&local_228);
  tcu::TestLog::startSection
            (this_00,(char *)submitInfoReset._0_8_,(char *)submitInfoReset.pWaitDstStageMask);
  if ((VkCommandBuffer **)submitInfoReset.pWaitDstStageMask != &submitInfoReset.pCommandBuffers) {
    operator_delete(submitInfoReset.pWaitDstStageMask,(long)submitInfoReset.pCommandBuffers + 1);
  }
  if ((deUint32 *)submitInfoReset._0_8_ != &submitInfoReset.waitSemaphoreCount) {
    operator_delete((void *)submitInfoReset._0_8_,submitInfoReset._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)
      resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(resultsBuffer.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  pTVar11 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ppvVar2 = &submitInfoReset.pNext;
  ppvVar3 = &submitInfoReset.pNext;
  lVar19 = 0;
  do {
    submitInfoReset._0_8_ = pTVar11;
    if ((this->m_testVector).queryResultsAvailability == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,"query[ slot == ",0xf);
      std::ostream::operator<<(ppvVar2,(int)lVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,"] result == ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)ppvVar2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar3,"query[ slot == ",0xf);
      std::ostream::operator<<(ppvVar3,(int)lVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar3,"] result == ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)ppvVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar3,", availability\t== ",0x12);
      std::ostream::_M_insert<unsigned_long>((ulong)ppvVar3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&submitInfoReset.pNext);
    std::ios_base::~ios_base(local_150);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  VVar8 = (this->m_testVector).primitiveTopology;
  pTVar11 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ppvVar2 = &submitInfoReset.pNext;
  bVar13 = true;
  uVar23 = 0;
  do {
    iVar22 = (int)uVar23;
    if (((this->m_testVector).queryResultsAvailability == true) && (queryAvailability[uVar23] == 0))
    {
      if (OVar5 == WAIT_NONE) {
LAB_006c200a:
        uVar18 = 0;
        uVar17 = 0;
        goto LAB_006c201a;
      }
      submitInfoReset._0_8_ = pTVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&submitInfoReset.pNext);
      ppvVar3 = &submitInfoReset.pNext;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar3,"query results availability was 0 for index ",0x2b);
      std::ostream::operator<<(ppvVar3,iVar22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar3,", expected any value greater than 0.",0x24);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar3);
      std::ios_base::~ios_base(local_150);
LAB_006c2285:
      bVar13 = false;
    }
    else {
      if (VVar8 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
        uVar18 = 0;
        if (uVar23 < 2) {
          uVar18 = 0x7c2;
        }
        uVar17 = 0;
        if (uVar23 < 2) {
          uVar17 = 0x83d;
        }
      }
      else {
        if (VVar8 != VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
          pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar16,"Unsupported primitive topology",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                     ,0x3f4);
          __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if (iVar22 == 0) {
          uVar18 = 3;
          uVar17 = 3;
        }
        else {
          if (iVar22 != 1) goto LAB_006c200a;
          uVar18 = 1;
          uVar17 = 1;
        }
      }
LAB_006c201a:
      uVar12 = queryResults[uVar23];
      if ((uVar17 == 0 && uVar18 == 0) || (((this->m_testVector).queryControlFlags & 1) != 0)) {
        if (uVar12 < uVar18 || uVar17 < uVar12) {
          submitInfoReset._0_8_ = pTVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar2,"wrong value of query for index ",0x1f);
          std::ostream::operator<<(ppvVar2,iVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar2,", expected the value minimum of ",0x20);
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,", maximum of ",0xd)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," got ",5);
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,".",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage
                    );
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
          std::ios_base::~ios_base(local_150);
          goto LAB_006c2285;
        }
      }
      else if (uVar12 == 0) {
        submitInfoReset._0_8_ = pTVar11;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&submitInfoReset.pNext);
        ppvVar3 = &submitInfoReset.pNext;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar3,"wrong value of query for index ",0x1f);
        std::ostream::operator<<(ppvVar3,iVar22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar3,", expected any non-zero value, got ",0x23);
        std::ostream::_M_insert<unsigned_long>((ulong)ppvVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar3,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar3);
        std::ios_base::~ios_base(local_150);
        bVar13 = false;
      }
    }
    uVar23 = uVar23 + 1;
    if (uVar23 == 3) {
      tcu::TestLog::endSection(this_00);
      if ((this->m_testVector).queryResultsMode != RESULTS_MODE_COPY) {
        VVar14 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar15);
        ::vk::checkResult(VVar14,"vk.queueWaitIdle(queue)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                          ,0x2d9);
      }
      pdVar4 = &submitInfoReset.waitSemaphoreCount;
      submitInfoReset._0_8_ = pdVar4;
      if (bVar13) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&submitInfoReset,"Query result verification passed","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,submitInfoReset._0_8_,
                   (long)submitInfoReset.pNext + submitInfoReset._0_8_);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&submitInfoReset,"Query result verification failed","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,submitInfoReset._0_8_,
                   (long)submitInfoReset.pNext + submitInfoReset._0_8_);
      }
      if ((deUint32 *)submitInfoReset._0_8_ != pdVar4) {
        operator_delete((void *)submitInfoReset._0_8_,submitInfoReset._16_8_ + 1);
      }
      if (vertices.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vertices.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vertices.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vertices.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus OcclusionQueryTestInstance::iterate (void)
{
	const vk::VkQueue			queue		= m_context.getUniversalQueue();
	const vk::DeviceInterface&	vk			= m_context.getDeviceInterface();
	tcu::TestLog&				log			= m_context.getTestContext().getLog();
	std::vector<tcu::Vec4>		vertices	(NUM_VERTICES);

	// 1st triangle
	vertices[START_VERTEX + 0] = tcu::Vec4( 0.5,  0.5, 0.5, 1.0);
	vertices[START_VERTEX + 1] = tcu::Vec4( 0.5, -0.5, 0.5, 1.0);
	vertices[START_VERTEX + 2] = tcu::Vec4(-0.5,  0.5, 0.5, 1.0);
	// 2nd triangle - partially occluding the scene
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 0] = tcu::Vec4(-0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 1] = tcu::Vec4( 0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 2] = tcu::Vec4(-0.5,  0.5, 1.0, 1.0);
	// 3nd triangle - fully occluding the scene
	vertices[START_VERTEX_OCCLUDER + 0] = tcu::Vec4( 0.5,  0.5, 1.0, 1.0);
	vertices[START_VERTEX_OCCLUDER + 1] = tcu::Vec4( 0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_OCCLUDER + 2] = tcu::Vec4(-0.5,  0.5, 1.0, 1.0);

	m_stateObjects->setVertices(vk, vertices);

	if (hasSeparateResetCmdBuf())
	{
		const vk::VkSubmitInfo		submitInfoReset =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// deUint32					waitSemaphoreCount;
			DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,											// deUint32					commandBufferCount;
			&m_queryPoolResetCommandBuffer.get(),		// const VkCommandBuffer*	pCommandBuffers;
			0u,											// deUint32					signalSemaphoreCount;
			DE_NULL										// const VkSemaphore*		pSignalSemaphores;
		};

		vk.queueSubmit(queue, 1, &submitInfoReset, DE_NULL);

		// Trivially wait for reset to complete. This is to ensure the query pool is in reset state before
		// host accesses, so as to not insert any synchronization before capturing the results needed for WAIT_NONE
		// variant of test.
		VK_CHECK(vk.queueWaitIdle(queue));
	}

	{
		const vk::VkSubmitInfo submitInfoRender =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_renderCommandBuffer.get(),		// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		vk.queueSubmit(queue, 1, &submitInfoRender, DE_NULL);
	}

	if (m_testVector.queryWait == WAIT_QUEUE)
	{
		VK_CHECK(vk.queueWaitIdle(queue));
	}

	if (hasSeparateCopyCmdBuf())
	{
		// In case of WAIT_QUEUE test variant, the previously submitted m_renderCommandBuffer did not
		// contain vkCmdCopyQueryResults, so additional cmd buffer is needed.

		// In the case of WAIT_NONE or WAIT_QUERY, vkCmdCopyQueryResults is stored in m_renderCommandBuffer.

		const vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_copyResultsCommandBuffer.get(),	// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);
	}

	if (m_testVector.queryResultsMode == RESULTS_MODE_COPY)
	{
		// In case of vkCmdCopyQueryResults is used, test must always wait for it
		// to complete before we can read the result buffer.

		VK_CHECK(vk.queueWaitIdle(queue));
	}

	deUint64 queryResults		[NUM_QUERIES_IN_POOL];
	deUint64 queryAvailability	[NUM_QUERIES_IN_POOL];

	// Allow not ready results only if nobody waited before getting the query results
	bool	allowNotReady		= (m_testVector.queryWait == WAIT_NONE);

	captureResults(queryResults, queryAvailability, allowNotReady);

	log << tcu::TestLog::Section("OcclusionQueryResults", "Occlusion query results");

	logResults(queryResults, queryAvailability);
	bool passed = validateResults(queryResults, queryAvailability, allowNotReady, m_testVector.primitiveTopology);

	log << tcu::TestLog::EndSection;

	if (m_testVector.queryResultsMode != RESULTS_MODE_COPY)
	{
		VK_CHECK(vk.queueWaitIdle(queue));
	}

		if (passed)
	{
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Query result verification passed");
	}
	return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Query result verification failed");
}